

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

_Bool menu_handle_mouse(menu_conflict *menu,ui_event *in,ui_event *out)

{
  _Bool _Var1;
  int cursor;
  int local_34;
  int count;
  int new_cursor;
  ui_event *out_local;
  ui_event *in_local;
  menu_conflict *menu_local;
  
  if ((in->mouse).button == '\x02') {
    out->type = EVT_ESCAPE;
  }
  else {
    _Var1 = region_inside(&menu->active,in);
    if (_Var1) {
      if (menu->filter_list == (int *)0x0) {
        local_34 = menu->count;
      }
      else {
        local_34 = menu->filter_count;
      }
      cursor = (*menu->skin->get_cursor)
                         ((int)(in->mouse).y,(int)(in->mouse).x,local_34,menu->top,&menu->active);
      _Var1 = is_valid_row(menu,cursor);
      if (_Var1) {
        if ((cursor == menu->cursor) || ((menu->flags & 0x10U) == 0)) {
          out->type = EVT_SELECT;
        }
        else {
          out->type = EVT_MOVE;
        }
        menu->cursor = cursor;
      }
      else if (menu->context_hook != (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)0x0)
      {
        _Var1 = (*menu->context_hook)(menu,in,out);
        return _Var1;
      }
    }
    else {
      _Var1 = region_inside(&menu->active,in);
      if ((_Var1) || ((menu->active).col <= (int)(uint)(in->mouse).x)) {
        if (menu->context_hook != (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)0x0) {
          _Var1 = (*menu->context_hook)(menu,in,out);
          return _Var1;
        }
      }
      else {
        out->type = EVT_ESCAPE;
      }
    }
  }
  return out->type != EVT_NONE;
}

Assistant:

bool menu_handle_mouse(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	int new_cursor;

	if (in->mouse.button == 2) {
		out->type = EVT_ESCAPE;
	} else if (!region_inside(&menu->active, in)) {
		/* A click to the left of the active region is 'back' */
		if (!region_inside(&menu->active, in)
				&& in->mouse.x < menu->active.col) {
			out->type = EVT_ESCAPE;
		} else if (menu->context_hook) {
			return (*menu->context_hook)(menu, in, out);
		}
	} else {
		int count = menu->filter_list ? menu->filter_count : menu->count;

		new_cursor = menu->skin->get_cursor(in->mouse.y, in->mouse.x,
				count, menu->top, &menu->active);
	
		if (is_valid_row(menu, new_cursor)) {
			if (new_cursor == menu->cursor || !(menu->flags & MN_DBL_TAP))
				out->type = EVT_SELECT;
			else
				out->type = EVT_MOVE;

			menu->cursor = new_cursor;
		} else if (menu->context_hook) {
			return (*menu->context_hook)(menu, in, out);
		}
	}

	return out->type != EVT_NONE;
}